

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

int Abc_NtkCrossCut_rec(Abc_Obj_t *pObj,int *pnCutSize,int *pnCutSizeMax)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = *(uint *)&pObj->field_0x14 & 0xf;
  uVar3 = 0;
  if ((uVar5 != 2) && (uVar5 != 5)) {
    iVar2 = Abc_NodeIsTravIdCurrent(pObj);
    if (iVar2 == 0) {
      Abc_NodeSetTravIdCurrent(pObj);
      uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
      iVar2 = 0;
      if ((uVar3 != 2) && (iVar2 = 0, uVar3 != 5)) {
        iVar2 = 0;
        for (lVar6 = 0; lVar6 < (pObj->vFanins).nSize; lVar6 = lVar6 + 1) {
          iVar4 = Abc_NtkCrossCut_rec((Abc_Obj_t *)
                                      pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]],
                                      pnCutSize,pnCutSizeMax);
          iVar2 = iVar2 + iVar4;
        }
      }
      iVar1 = *pnCutSize;
      iVar4 = iVar1 + 1;
      *pnCutSize = iVar4;
      if (*pnCutSizeMax <= iVar1) {
        *pnCutSizeMax = iVar4;
        iVar4 = *pnCutSize;
      }
      *pnCutSize = iVar4 - iVar2;
    }
    iVar2 = (pObj->field_6).iTemp + 1;
    pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar2;
    uVar3 = (uint)(iVar2 == (pObj->vFanouts).nSize);
  }
  return uVar3;
}

Assistant:

static inline int         Abc_ObjIsCi( Abc_Obj_t * pObj )            { return pObj->Type == ABC_OBJ_PI || pObj->Type == ABC_OBJ_BO; }